

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZReschedulableTask.cpp
# Opt level: O2

void __thiscall TPZReschedulableTask::start(TPZReschedulableTask *this)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_18;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_18,&this->mStateMutex);
  if ((int)(this->super_TPZTask).mState < 2) {
    (*(this->super_TPZTask)._vptr_TPZTask[4])(this);
    std::unique_lock<std::mutex>::~unique_lock(&uStack_18);
    std::condition_variable::notify_all();
  }
  else {
    std::unique_lock<std::mutex>::~unique_lock(&uStack_18);
  }
  return;
}

Assistant:

void TPZReschedulableTask::start() {
    bool executed = false;
    {
        std::unique_lock<std::mutex> lock(mStateMutex);
        if (mState <= TPZReschedulableTask::SCHEDULED) {
            this->startInternal();
            executed = true;
        }
    }
    if (executed) {
        mCondition.notify_all();
    }
}